

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::BitsFunction::BitsFunction(BitsFunction *this)

{
  allocator<char> local_31;
  string local_30;
  BitsFunction *local_10;
  BitsFunction *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$bits",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine = (_func_int **)&PTR__BitsFunction_00916ce0;
  return;
}

Assistant:

BitsFunction() : SystemSubroutine("$bits", SubroutineKind::Function) {}